

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotShadedEx<ImPlot::GetterYs<float>,ImPlot::GetterYRef>
               (char *label_id,GetterYs<float> *getter1,GetterYRef *getter2,bool fit2)

{
  float fVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  float *pfVar9;
  ImPlotPlot *pIVar10;
  undefined1 auVar11 [16];
  ImPlotRange *pIVar12;
  ImPlotContext *pIVar13;
  bool bVar14;
  int iVar15;
  ImU32 col;
  ImDrawList *DrawList;
  undefined7 in_register_00000009;
  byte bVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  double dVar30;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  TransformerLinLin local_7c;
  GetterYRef *local_78;
  GetterYs<float> *local_70;
  undefined4 local_68;
  uint local_64;
  ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin> local_60;
  
  bVar14 = BeginItem(label_id,1);
  pIVar13 = GImPlot;
  if (bVar14) {
    if (GImPlot->FitThisFrame == true) {
      local_68 = (undefined4)CONCAT71(in_register_00000009,fit2);
      iVar15 = getter1->Count;
      if (0 < iVar15) {
        dVar2 = getter1->X0;
        dVar3 = getter1->XScale;
        pfVar9 = getter1->Ys;
        iVar4 = getter1->Offset;
        iVar5 = getter1->Stride;
        pIVar10 = GImPlot->CurrentPlot;
        iVar6 = pIVar10->CurrentYAxis;
        uVar7 = (pIVar10->XAxis).Flags;
        pIVar12 = GImPlot->ExtentsY;
        uVar8 = pIVar10->YAxis[iVar6].Flags;
        iVar17 = 0;
        local_64 = uVar8 & 0x20;
        dVar21 = 0.0;
        do {
          dVar24 = dVar3 * dVar21 + dVar2;
          fVar1 = *(float *)((long)pfVar9 +
                            (long)(((iVar4 + iVar17) % iVar15 + iVar15) % iVar15) * (long)iVar5);
          dVar22 = (double)fVar1;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((long)ABS(dVar24) < 0x7ff0000000000000) {
LAB_001e827d:
              if ((0.0 < dVar24) || ((uVar7 & 0x20) == 0)) {
                dVar27 = (pIVar13->ExtentsX).Min;
                dVar30 = (pIVar13->ExtentsX).Max;
                uVar18 = -(ulong)(dVar24 < dVar27);
                uVar19 = -(ulong)(dVar30 < dVar24);
                (pIVar13->ExtentsX).Min = (double)(~uVar18 & (ulong)dVar27 | (ulong)dVar24 & uVar18)
                ;
                (pIVar13->ExtentsX).Max = (double)(~uVar19 & (ulong)dVar30 | (ulong)dVar24 & uVar19)
                ;
              }
            }
          }
          else if ((((long)ABS(dVar24) < 0x7ff0000000000000) &&
                   (pIVar10->YAxis[iVar6].Range.Min <= dVar22)) &&
                  (dVar22 <= pIVar10->YAxis[iVar6].Range.Max)) goto LAB_001e827d;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((long)ABS(dVar22) < 0x7ff0000000000000) {
LAB_001e8304:
              if ((0.0 < fVar1) || (local_64 == 0)) {
                dVar24 = pIVar12[iVar6].Min;
                dVar27 = pIVar13->ExtentsY[iVar6].Max;
                uVar18 = -(ulong)(dVar22 < dVar24);
                uVar19 = -(ulong)(dVar27 < dVar22);
                auVar23._0_8_ = (ulong)dVar22 & uVar18;
                auVar23._8_8_ = (ulong)dVar22 & uVar19;
                auVar28._0_8_ = ~uVar18 & (ulong)dVar24;
                auVar28._8_8_ = ~uVar19 & (ulong)dVar27;
                pIVar12[iVar6] = (ImPlotRange)(auVar28 | auVar23);
              }
            }
          }
          else if ((((long)ABS(dVar22) < 0x7ff0000000000000) &&
                   ((pIVar10->XAxis).Range.Min <= dVar24)) && (dVar24 <= (pIVar10->XAxis).Range.Max)
                  ) goto LAB_001e8304;
          dVar21 = dVar21 + 1.0;
          iVar17 = iVar17 + 1;
        } while (iVar15 != iVar17);
      }
      if ((fit2) && (iVar15 = getter2->Count, 0 < iVar15)) {
        dVar2 = getter2->X0;
        dVar3 = getter2->YRef;
        dVar21 = getter2->XScale;
        pIVar10 = pIVar13->CurrentPlot;
        iVar4 = pIVar10->CurrentYAxis;
        uVar7 = (pIVar10->XAxis).Flags;
        uVar8 = pIVar10->YAxis[iVar4].Flags;
        pIVar12 = pIVar13->ExtentsY + iVar4;
        bVar16 = dVar3 <= 0.0 & (byte)((uVar8 & 0x20) >> 5);
        dVar22 = 0.0;
        do {
          dVar24 = dVar21 * dVar22 + dVar2;
          if ((uVar7 >> 10 & 1) == 0) {
            if ((long)ABS(dVar24) < 0x7ff0000000000000) {
LAB_001e843f:
              if ((0.0 < dVar24) || ((uVar7 & 0x20) == 0)) {
                dVar27 = (pIVar13->ExtentsX).Min;
                dVar30 = (pIVar13->ExtentsX).Max;
                uVar18 = -(ulong)(dVar24 < dVar27);
                uVar19 = -(ulong)(dVar30 < dVar24);
                auVar25._0_8_ = (ulong)dVar24 & uVar18;
                auVar25._8_8_ = (ulong)dVar24 & uVar19;
                auVar29._0_8_ = ~uVar18 & (ulong)dVar27;
                auVar29._8_8_ = ~uVar19 & (ulong)dVar30;
                pIVar13->ExtentsX = (ImPlotRange)(auVar29 | auVar25);
              }
            }
          }
          else if ((((long)ABS(dVar24) < 0x7ff0000000000000) &&
                   (pIVar10->YAxis[iVar4].Range.Min <= dVar3)) &&
                  (dVar3 <= pIVar10->YAxis[iVar4].Range.Max)) goto LAB_001e843f;
          if ((uVar8 >> 10 & 1) == 0) {
            if ((ulong)ABS(dVar3) < 0x7ff0000000000000 && bVar16 == 0) {
LAB_001e849b:
              uVar19 = -(ulong)(dVar3 < pIVar12->Min);
              uVar20 = -(ulong)(pIVar12->Max < dVar3);
              uVar18 = (ulong)dVar3 & uVar20;
              auVar26._0_8_ = ~uVar19 & (ulong)pIVar12->Min;
              auVar26._8_8_ = ~uVar20 & (ulong)pIVar12->Max;
              auVar11._8_4_ = (int)uVar18;
              auVar11._0_8_ = (ulong)dVar3 & uVar19;
              auVar11._12_4_ = (int)(uVar18 >> 0x20);
              *pIVar12 = (ImPlotRange)(auVar26 | auVar11);
            }
          }
          else if (((ulong)ABS(dVar3) < 0x7ff0000000000000 && bVar16 == 0) &&
                   (dVar24 <= (pIVar10->XAxis).Range.Max && (pIVar10->XAxis).Range.Min <= dVar24))
          goto LAB_001e849b;
          dVar22 = dVar22 + 1.0;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
    }
    local_78 = getter2;
    local_70 = getter1;
    DrawList = GetPlotDrawList();
    if ((pIVar13->NextItemData).RenderFill == true) {
      col = ImGui::GetColorU32((pIVar13->NextItemData).Colors + 1);
      iVar15 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar15]) {
      case 0:
        local_7c.YAxis = iVar15;
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>::
        ShadedRenderer(&local_60,local_70,local_78,&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLinLin>>
                  (&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 1:
        local_7c.YAxis = iVar15;
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
        ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                        *)&local_60,local_70,local_78,(TransformerLogLin *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLogLin>>
                  ((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 2:
        local_7c.YAxis = iVar15;
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>::
        ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                        *)&local_60,local_70,local_78,(TransformerLinLog *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLinLog>>
                  ((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
        break;
      case 3:
        local_7c.YAxis = iVar15;
        ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
        ShadedRenderer((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                        *)&local_60,local_70,local_78,(TransformerLogLog *)&local_7c,col);
        RenderPrimitives<ImPlot::ShadedRenderer<ImPlot::GetterYs<float>,ImPlot::GetterYRef,ImPlot::TransformerLogLog>>
                  ((ShadedRenderer<ImPlot::GetterYs<float>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
                    *)&local_60,DrawList,&GImPlot->CurrentPlot->PlotRect);
      }
    }
    pIVar13 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar13->NextItemData);
    pIVar13->PreviousItem = pIVar13->CurrentItem;
    pIVar13->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotShadedEx(const char* label_id, const Getter1& getter1, const Getter2& getter2, bool fit2) {
    if (BeginItem(label_id, ImPlotCol_Fill)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter1.Count; ++i)
                FitPoint(getter1(i));
            if (fit2) {
                for (int i = 0; i < getter2.Count; ++i)
                    FitPoint(getter2(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList & DrawList = *GetPlotDrawList();
        if (s.RenderFill) {
            ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_Fill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLin>(getter1,getter2,TransformerLinLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLin: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLin>(getter1,getter2,TransformerLogLin(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LinLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLinLog>(getter1,getter2,TransformerLinLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
                case ImPlotScale_LogLog: RenderPrimitives(ShadedRenderer<Getter1,Getter2,TransformerLogLog>(getter1,getter2,TransformerLogLog(), col), DrawList, GImPlot->CurrentPlot->PlotRect); break;
            }
        }
        EndItem();
    }
}